

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  DistWeightSyntax *pDVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_41;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),&local_41,(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DistWeightSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,&local_30,&local_40,(ExpressionSyntax *)args_2)
  ;
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DistWeightSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DistWeightSyntax>(
        node.op.deepClone(alloc),
        node.extraOp.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc)
    );
}